

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.h
# Opt level: O0

vector<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
* polyscope::gather<glm::vec<2,unsigned_int,(glm::qualifier)0>>
            (vector<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
             *input,vector<unsigned_int,_std::allocator<unsigned_int>_> *perm)

{
  size_type sVar1;
  size_type sVar2;
  const_reference pvVar3;
  const_reference pvVar4;
  reference pvVar5;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RDX;
  vector<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
  *in_RSI;
  vector<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
  *in_RDI;
  size_t i;
  vector<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
  *result;
  allocator_type *in_stack_ffffffffffffffa0;
  vector<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
  *this;
  size_type local_38;
  vector<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
  *in_stack_ffffffffffffffd8;
  undefined7 in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffe7;
  
  sVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(in_RDX);
  if (sVar1 == 0) {
    std::
    vector<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
    ::vector((vector<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
              *)CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0),
             in_stack_ffffffffffffffd8);
  }
  else {
    sVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(in_RDX);
    this = (vector<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
            *)&stack0xffffffffffffffe6;
    std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>::allocator
              ((allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_> *)0x42b017);
    std::
    vector<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
    ::vector(this,sVar1,in_stack_ffffffffffffffa0);
    std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>::~allocator
              ((allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_> *)0x42b037);
    local_38 = 0;
    while (sVar1 = local_38,
          sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(in_RDX),
          sVar1 < sVar2) {
      pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](in_RDX,local_38)
      ;
      pvVar4 = std::
               vector<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
               ::operator[](in_RSI,(ulong)*pvVar3);
      pvVar5 = std::
               vector<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
               ::operator[](in_RDI,local_38);
      *pvVar5 = *pvVar4;
      local_38 = local_38 + 1;
    }
  }
  return in_RDI;
}

Assistant:

std::vector<T> gather(const std::vector<T>& input, const std::vector<uint32_t>& perm) {
  // TODO figure out if there's a copy to be avoided here
  if (perm.size() == 0) {
    return input;
  }
  std::vector<T> result(perm.size());
  for (size_t i = 0; i < perm.size(); i++) {
    result[i] = input[perm[i]];
  }
  return result;
}